

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# coded_stream.cc
# Opt level: O3

bool __thiscall
google::protobuf::io::CodedInputStream::ReadString(CodedInputStream *this,string *buffer,int size)

{
  pointer __dest;
  uint8_t *puVar1;
  bool bVar2;
  int iVar3;
  int extraout_EDX;
  char *pcVar4;
  CodedInputStream *this_00;
  int iVar5;
  int iVar6;
  char *__n;
  
  this_00 = (CodedInputStream *)&stack0xffffffffffffffd8;
  if (size < 0) {
    bVar2 = false;
  }
  else {
    if (*(int *)&this->buffer_end_ - *(int *)&this->buffer_ < size) {
      bVar2 = ReadStringFallback(this,buffer,size);
      return bVar2;
    }
    __n = (char *)(ulong)(uint)size;
    pcVar4 = __n;
    std::__cxx11::string::resize((ulong)buffer,(char)size);
    __dest = (buffer->_M_dataplus)._M_p;
    if (__dest == (pointer)0x0) {
      ReadString((CodedInputStream *)&stack0xffffffffffffffd8);
      if (*(long *)(pcVar4 + 8) != 0) {
        pcVar4[8] = '\0';
        pcVar4[9] = '\0';
        pcVar4[10] = '\0';
        pcVar4[0xb] = '\0';
        pcVar4[0xc] = '\0';
        pcVar4[0xd] = '\0';
        pcVar4[0xe] = '\0';
        pcVar4[0xf] = '\0';
        **(undefined1 **)pcVar4 = 0;
      }
      iVar3 = this_00->current_limit_;
      if (this_00->total_bytes_limit_ < this_00->current_limit_) {
        iVar3 = this_00->total_bytes_limit_;
      }
      iVar6 = extraout_EDX;
      if ((((iVar3 != 0x7fffffff) &&
           (iVar3 = (iVar3 - this_00->total_bytes_read_) + this_00->buffer_size_after_limit_ +
                    (*(int *)&this_00->buffer_end_ - *(int *)&this_00->buffer_),
           iVar6 = extraout_EDX, extraout_EDX <= iVar3)) && (iVar6 = extraout_EDX, 0 < extraout_EDX)
          ) && (iVar6 = extraout_EDX, 0 < iVar3)) {
        std::__cxx11::string::reserve((ulong)pcVar4);
        iVar6 = extraout_EDX;
      }
      do {
        iVar5 = iVar6;
        puVar1 = this_00->buffer_;
        iVar3 = (int)this_00->buffer_end_ - (int)puVar1;
        if (iVar5 - iVar3 == 0 || iVar5 < iVar3) {
          std::__cxx11::string::append(pcVar4,(ulong)puVar1);
          this_00->buffer_ = this_00->buffer_ + iVar5;
          break;
        }
        iVar6 = iVar5;
        if (iVar3 != 0) {
          std::__cxx11::string::append(pcVar4,(ulong)puVar1);
          this_00->buffer_ = this_00->buffer_ + iVar3;
          iVar6 = iVar5 - iVar3;
        }
        bVar2 = Refresh(this_00);
      } while (bVar2);
      return iVar5 <= iVar3;
    }
    memcpy(__dest,this->buffer_,(size_t)__n);
    this->buffer_ = (uint8_t *)(__n + (long)this->buffer_);
    bVar2 = true;
  }
  return bVar2;
}

Assistant:

bool CodedInputStream::ReadString(std::string* buffer, int size) {
  if (size < 0) return false;  // security: size is often user-supplied

  if (BufferSize() >= size) {
    absl::strings_internal::STLStringResizeUninitialized(buffer, size);
    std::pair<char*, bool> z = as_string_data(buffer);
    if (z.second) {
      // Oddly enough, memcpy() requires its first two args to be non-NULL even
      // if we copy 0 bytes.  So, we have ensured that z.first is non-NULL here.
      ABSL_DCHECK(z.first != NULL);
      memcpy(z.first, buffer_, size);
      Advance(size);
    }
    return true;
  }

  return ReadStringFallback(buffer, size);
}